

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O3

int wally_sha256d(uchar *bytes,size_t bytes_len,uchar *bytes_out,size_t len)

{
  int iVar1;
  sha256 sha_1;
  sha256 local_30;
  
  iVar1 = -2;
  if ((len == 0x20 && bytes_out != (uchar *)0x0) && (bytes_len == 0 || bytes != (uchar *)0x0)) {
    sha256(&local_30,bytes,bytes_len);
    sha256((sha256 *)bytes_out,&local_30,0x20);
    (*_ops.bzero_fn)(&local_30,0x20);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int wally_sha256d(const unsigned char *bytes, size_t bytes_len,
                  unsigned char *bytes_out, size_t len)
{
    struct sha256 sha_1, sha_2;
    bool aligned = alignment_ok(bytes_out, sizeof(sha_1.u.u32));

    if ((!bytes && bytes_len != 0) || !bytes_out || len != SHA256_LEN)
        return WALLY_EINVAL;

    sha256(&sha_1, bytes, bytes_len);
    sha256(aligned ? (struct sha256 *)bytes_out : &sha_2, &sha_1, sizeof(sha_1));
    if (!aligned) {
        memcpy(bytes_out, &sha_2, sizeof(sha_2));
        wally_clear(&sha_2, sizeof(sha_2));
    }
    wally_clear(&sha_1, sizeof(sha_1));
    return WALLY_OK;
}